

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

GLuint __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::getProgramResourceIndex
          (FunctionalTest3_4 *this,GLuint program_id,GLenum program_interface,GLchar *resource_name)

{
  int iVar1;
  GLuint GVar2;
  deUint32 err;
  undefined4 extraout_var;
  GLchar *__s;
  size_t sVar3;
  undefined1 local_1a8 [8];
  _func_int **local_1a0;
  ios_base local_130 [264];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  GVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x9a8))
                    (program_id,program_interface,resource_name);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"getProgramResourceIndex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xc7a);
  if (GVar2 == 0xffffffff) {
    local_1a8 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"Error. Program resource is not available. ",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"Program interface: ",0x13);
    __s = Utils::programInterfaceToStr(program_interface);
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,__s,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,". ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"Resource name: ",0xf);
    if (resource_name == (GLchar *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_1a0 + (int)local_1a0[-3]);
    }
    else {
      sVar3 = strlen(resource_name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,resource_name,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
    std::ios_base::~ios_base(local_130);
  }
  return GVar2;
}

Assistant:

GLuint FunctionalTest3_4::getProgramResourceIndex(GLuint program_id, GLenum program_interface,
												  const glw::GLchar* resource_name) const
{
	const glw::Functions& gl	= m_context.getRenderContext().getFunctions();
	GLuint				  index = gl.getProgramResourceIndex(program_id, program_interface, resource_name);

	GLU_EXPECT_NO_ERROR(gl.getError(), "getProgramResourceIndex");

	if (GL_INVALID_INDEX == index)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error. Program resource is not available. "
											<< "Program interface: " << Utils::programInterfaceToStr(program_interface)
											<< ". "
											<< "Resource name: " << resource_name << "." << tcu::TestLog::EndMessage;
	}

	return index;
}